

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

wchar_t * fmt::v5::internal::
          parse_width<wchar_t,fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>>>&>
                    (wchar_t *begin,wchar_t *end,
                    specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>_>
                    *handler)

{
  uint uVar1;
  specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>_>
  *in_RAX;
  error_handler *peVar2;
  assertion_failure *this;
  wchar_t wVar3;
  error_handler *peVar4;
  width_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>_>_&,_wchar_t>
  local_18;
  
  if (begin == end) {
    this = (assertion_failure *)__cxa_allocate_exception(0x10);
    assertion_failure::assertion_failure(this,"");
    __cxa_throw(this,&assertion_failure::typeinfo,std::logic_error::~logic_error);
  }
  wVar3 = *begin;
  if ((uint)(wVar3 + L'\xffffffd0') < 10) {
    peVar4 = (error_handler *)(begin + 1);
    uVar1 = 0;
    peVar2 = peVar4;
    begin = (wchar_t *)peVar4;
    if (wVar3 != L'0') {
      do {
        begin = (wchar_t *)peVar2;
        if (0xccccccc < uVar1) goto LAB_00129f2d;
        uVar1 = (wVar3 + uVar1 * 10) - 0x30;
        peVar4 = (error_handler *)begin;
        if (begin == end) break;
        wVar3 = *begin;
        peVar2 = (error_handler *)((long)begin + 4);
      } while ((uint)(wVar3 + L'\xffffffd0') < 10);
      if ((int)uVar1 < 0) {
LAB_00129f2d:
        error_handler::on_error(peVar4,"number is too big");
      }
    }
    (((handler->
      super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
      ).super_specs_setter<wchar_t>.specs_)->super_align_spec).width_ = uVar1;
  }
  else if (wVar3 == L'{') {
    peVar2 = (error_handler *)(begin + 1);
    local_18.handler = in_RAX;
    if (peVar2 != (error_handler *)end) {
      local_18.handler = handler;
      peVar2 = (error_handler *)
               parse_arg_id<wchar_t,fmt::v5::internal::width_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>>>&,wchar_t>>
                         ((wchar_t *)peVar2,end,&local_18);
    }
    if ((peVar2 == (error_handler *)end) || (*(int *)peVar2 != 0x7d)) {
      error_handler::on_error(peVar2,"invalid format string");
    }
    begin = (wchar_t *)(peVar2 + 4);
  }
  return (wchar_t *)(error_handler *)begin;
}

Assistant:

FMT_CONSTEXPR const Char *parse_width(
    const Char *begin, const Char *end, Handler &&handler) {
  FMT_ASSERT(begin != end, "");
  if ('0' <= *begin && *begin <= '9') {
    handler.on_width(parse_nonnegative_int(begin, end, handler));
  } else if (*begin == '{') {
    ++begin;
    if (begin != end)
      begin = parse_arg_id(begin, end, width_adapter<Handler, Char>(handler));
    if (begin == end || *begin != '}')
      return handler.on_error("invalid format string"), begin;
    ++begin;
  }
  return begin;
}